

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

uint8_t __thiscall
icu_63::Normalizer2Impl::getPreviousTrailCC(Normalizer2Impl *this,uint8_t *start,uint8_t *p)

{
  byte bVar1;
  uint16_t uVar2;
  uint c;
  int iVar3;
  int32_t i;
  int local_c;
  
  if (start != p) {
    iVar3 = (int)p - (int)start;
    local_c = iVar3 + -1;
    bVar1 = start[(long)iVar3 + -1];
    c = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      c = utf8_prevCharSafeBody_63(start,0,&local_c,(uint)bVar1,-1);
    }
    uVar2 = getFCD16(this,c);
    return (uint8_t)uVar2;
  }
  return '\0';
}

Assistant:

uint8_t Normalizer2Impl::getPreviousTrailCC(const uint8_t *start, const uint8_t *p) const {
    if (start == p) {
        return 0;
    }
    int32_t i = (int32_t)(p - start);
    UChar32 c;
    U8_PREV(start, 0, i, c);
    return (uint8_t)getFCD16(c);
}